

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void foreach_rest_unit_in_planes_mt
               (AV1LrStruct *lr_ctxt,AVxWorker *workers,int num_workers,AV1LrSync *lr_sync,
               AV1_COMMON *cm,int do_extend_border)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AVxWorkerInterface *pAVar4;
  AVxWorker *pAVar5;
  void *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  AV1_COMMON *in_R8;
  undefined4 in_R9D;
  AV1_COMMON *unaff_retaddr;
  AV1LrStruct *in_stack_00000008;
  AVxWorker *worker;
  int i;
  int unit_size;
  int plane_h;
  int plane;
  int num_rows_lr;
  AVxWorkerInterface *winterface;
  int num_planes;
  FilterFrameCtxt *ctxt;
  int in_stack_00000154;
  AV1_COMMON *in_stack_00000158;
  AVxWorker *in_stack_00000160;
  undefined8 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar2 = av1_num_planes(in_R8);
  pAVar4 = aom_get_worker_interface();
  iVar7 = 0;
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    if (in_R8->rst_info[iVar6].frame_restoration_type != RESTORE_NONE) {
      in_stack_ffffffffffffffac = *(int *)(in_RDI + (long)iVar6 * 0x38 + 0x1c);
      in_stack_ffffffffffffffa8 = in_R8->rst_info[iVar6].restoration_unit_size;
      iVar8 = iVar7;
      iVar3 = av1_lr_count_units(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffac);
      bVar1 = iVar7 <= iVar3;
      iVar7 = iVar8;
      if (bVar1) {
        iVar7 = av1_lr_count_units(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffac);
      }
    }
  }
  if ((((*(int *)((long)in_RCX + 0x48) == 0) || (*(int *)((long)in_RCX + 0x4c) < iVar7)) ||
      (*(int *)((long)in_RCX + 0x54) < in_EDX)) || (*(int *)((long)in_RCX + 0x50) < iVar2)) {
    av1_loop_restoration_dealloc
              ((AV1LrSync *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    av1_loop_restoration_alloc
              ((AV1LrSync *)CONCAT44(iVar7,iVar6),
               (AV1_COMMON *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
               (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
  }
  *(undefined1 *)((long)in_RCX + 0x78) = 0;
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    memset(*(void **)((long)in_RCX + (long)iVar6 * 8 + 0x30),0xff,(long)iVar7 << 2);
  }
  enqueue_lr_jobs((AV1LrSync *)worker,in_stack_00000008,unaff_retaddr);
  for (iVar7 = in_EDX + -1; -1 < iVar7; iVar7 = iVar7 + -1) {
    pAVar5 = (AVxWorker *)(in_RSI + (long)iVar7 * 0x38);
    *(long *)(*(long *)((long)in_RCX + 0x60) + (long)iVar7 * 0x1c0 + 0x10) = in_RDI;
    *(undefined4 *)(*(long *)((long)in_RCX + 0x60) + (long)iVar7 * 0x1c0 + 0x18) = in_R9D;
    pAVar5->hook = loop_restoration_row_worker;
    pAVar5->data1 = in_RCX;
    pAVar5->data2 = (void *)(*(long *)((long)in_RCX + 0x60) + (long)iVar7 * 0x1c0);
    pAVar5->had_error = 0;
    if (iVar7 == 0) {
      (*pAVar4->execute)(pAVar5);
    }
    else {
      (*pAVar4->launch)(pAVar5);
    }
  }
  sync_lr_workers(in_stack_00000160,in_stack_00000158,in_stack_00000154);
  return;
}

Assistant:

static void foreach_rest_unit_in_planes_mt(AV1LrStruct *lr_ctxt,
                                           AVxWorker *workers, int num_workers,
                                           AV1LrSync *lr_sync, AV1_COMMON *cm,
                                           int do_extend_border) {
  FilterFrameCtxt *ctxt = lr_ctxt->ctxt;

  const int num_planes = av1_num_planes(cm);

  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  int num_rows_lr = 0;

  for (int plane = 0; plane < num_planes; plane++) {
    if (cm->rst_info[plane].frame_restoration_type == RESTORE_NONE) continue;

    const int plane_h = ctxt[plane].plane_h;
    const int unit_size = cm->rst_info[plane].restoration_unit_size;

    num_rows_lr = AOMMAX(num_rows_lr, av1_lr_count_units(unit_size, plane_h));
  }

  int i;
  assert(MAX_MB_PLANE == 3);

  if (!lr_sync->sync_range || num_rows_lr > lr_sync->rows ||
      num_workers > lr_sync->num_workers || num_planes > lr_sync->num_planes) {
    av1_loop_restoration_dealloc(lr_sync);
    av1_loop_restoration_alloc(lr_sync, cm, num_workers, num_rows_lr,
                               num_planes, cm->width);
  }
  lr_sync->lr_mt_exit = false;

  // Initialize cur_sb_col to -1 for all SB rows.
  for (i = 0; i < num_planes; i++) {
    memset(lr_sync->cur_sb_col[i], -1,
           sizeof(*(lr_sync->cur_sb_col[i])) * num_rows_lr);
  }

  enqueue_lr_jobs(lr_sync, lr_ctxt, cm);

  // Set up looprestoration thread data.
  for (i = num_workers - 1; i >= 0; --i) {
    AVxWorker *const worker = &workers[i];
    lr_sync->lrworkerdata[i].lr_ctxt = (void *)lr_ctxt;
    lr_sync->lrworkerdata[i].do_extend_border = do_extend_border;
    worker->hook = loop_restoration_row_worker;
    worker->data1 = lr_sync;
    worker->data2 = &lr_sync->lrworkerdata[i];

    // Start loop restoration
    worker->had_error = 0;
    if (i == 0) {
      winterface->execute(worker);
    } else {
      winterface->launch(worker);
    }
  }

  sync_lr_workers(workers, cm, num_workers);
}